

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmax_distance.cpp
# Opt level: O1

double __thiscall
ProbabEstimator::getProbabLtFast1
          (ProbabEstimator *this,double maxValInReplaced,int numReplaced,int pathLength)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  int iVar5;
  uint uVar6;
  undefined1 auVar7 [32];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  double dVar11;
  double dVar12;
  double dVar13;
  undefined1 auVar14 [64];
  double vals [20];
  double adStack_c8 [4];
  long alStack_a8 [19];
  
  adStack_c8[1] = 5.29854773094695e-318;
  dVar11 = DistribFunction::getDistrib(this->distribFunction,maxValInReplaced);
  adStack_c8[2] = 1.0;
  uVar2 = (ulong)(uint)numReplaced;
  if (0 < numReplaced) {
    dVar12 = 1.0;
    uVar3 = 0;
    iVar5 = pathLength;
    do {
      adStack_c8[uVar3 + 2] = dVar12;
      uVar3 = uVar3 + 1;
      dVar12 = (dVar12 * (double)iVar5) / (double)(int)uVar3;
      iVar5 = iVar5 + -1;
    } while (uVar2 != uVar3);
  }
  dVar12 = 1.0;
  if (1 < numReplaced) {
    uVar3 = 1;
    dVar13 = 1.0 - dVar11;
    do {
      adStack_c8[uVar3 + 2] = dVar13 * adStack_c8[uVar3 + 2];
      dVar13 = dVar13 * (1.0 - dVar11);
      uVar3 = uVar3 + 1;
    } while (uVar2 != uVar3);
  }
  uVar6 = (pathLength - numReplaced) + 1;
  if (uVar6 != 0) {
    dVar12 = 1.0;
    dVar13 = dVar11;
    do {
      dVar12 = (double)((ulong)((byte)uVar6 & 1) * (long)(dVar13 * dVar12) +
                       (ulong)!(bool)((byte)uVar6 & 1) * (long)dVar12);
      dVar13 = dVar13 * dVar13;
      bVar1 = 1 < uVar6;
      uVar6 = (int)uVar6 >> 1;
    } while (bVar1);
  }
  if (0 < numReplaced) {
    lVar4 = uVar2 + 1;
    do {
      adStack_c8[lVar4] = dVar12 * adStack_c8[lVar4];
      dVar12 = dVar12 * dVar11;
      lVar4 = lVar4 + -1;
    } while (1 < lVar4);
  }
  if (numReplaced < 1) {
    dVar11 = 0.0;
  }
  else {
    auVar8 = vpbroadcastq_avx512f();
    uVar2 = 0;
    auVar9 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar10 = ZEXT864(0) << 0x40;
    do {
      auVar14 = auVar10;
      auVar10 = vpbroadcastq_avx512f();
      auVar10 = vporq_avx512f(auVar10,auVar9);
      uVar3 = vpcmpuq_avx512f(auVar10,auVar8,2);
      auVar10._8_8_ = (ulong)((byte)(uVar3 >> 1) & 1) * alStack_a8[uVar2 - 1];
      auVar10._0_8_ = (ulong)((byte)uVar3 & 1) * (long)adStack_c8[uVar2 + 2];
      auVar10._16_8_ = (ulong)((byte)(uVar3 >> 2) & 1) * alStack_a8[uVar2];
      auVar10._24_8_ = (ulong)((byte)(uVar3 >> 3) & 1) * alStack_a8[uVar2 + 1];
      auVar10._32_8_ = (ulong)((byte)(uVar3 >> 4) & 1) * alStack_a8[uVar2 + 2];
      auVar10._40_8_ = (ulong)((byte)(uVar3 >> 5) & 1) * alStack_a8[uVar2 + 3];
      auVar10._48_8_ = (ulong)((byte)(uVar3 >> 6) & 1) * alStack_a8[uVar2 + 4];
      auVar10._56_8_ = (uVar3 >> 7) * alStack_a8[uVar2 + 5];
      auVar10 = vaddpd_avx512f(auVar10,auVar14);
      uVar2 = uVar2 + 8;
    } while ((numReplaced + 7U & 0xfffffff8) != uVar2);
    bVar1 = (bool)((byte)uVar3 & 1);
    auVar8._0_8_ = (ulong)bVar1 * auVar10._0_8_ | (ulong)!bVar1 * auVar14._0_8_;
    bVar1 = (bool)((byte)(uVar3 >> 1) & 1);
    auVar8._8_8_ = (ulong)bVar1 * auVar10._8_8_ | (ulong)!bVar1 * auVar14._8_8_;
    bVar1 = (bool)((byte)(uVar3 >> 2) & 1);
    auVar8._16_8_ = (ulong)bVar1 * auVar10._16_8_ | (ulong)!bVar1 * auVar14._16_8_;
    bVar1 = (bool)((byte)(uVar3 >> 3) & 1);
    auVar8._24_8_ = (ulong)bVar1 * auVar10._24_8_ | (ulong)!bVar1 * auVar14._24_8_;
    bVar1 = (bool)((byte)(uVar3 >> 4) & 1);
    auVar8._32_8_ = (ulong)bVar1 * auVar10._32_8_ | (ulong)!bVar1 * auVar14._32_8_;
    bVar1 = (bool)((byte)(uVar3 >> 5) & 1);
    auVar8._40_8_ = (ulong)bVar1 * auVar10._40_8_ | (ulong)!bVar1 * auVar14._40_8_;
    bVar1 = (bool)((byte)(uVar3 >> 6) & 1);
    auVar8._48_8_ = (ulong)bVar1 * auVar10._48_8_ | (ulong)!bVar1 * auVar14._48_8_;
    auVar8._56_8_ = (uVar3 >> 7) * auVar10._56_8_ | (ulong)!SUB81(uVar3 >> 7,0) * auVar14._56_8_;
    auVar7 = vextractf64x4_avx512f(auVar8,1);
    auVar10 = vaddpd_avx512f(auVar8,ZEXT3264(auVar7));
    dVar11 = auVar10._0_8_ + auVar10._16_8_ + auVar10._8_8_ + auVar10._24_8_;
  }
  return dVar11;
}

Assistant:

double ProbabEstimator::getProbabLtFast1( const double maxValInReplaced, const int numReplaced, const int pathLength ){
    double  PAr1 = distribFunction->getDistrib( maxValInReplaced );
    double cPAr1 = 1.0-PAr1;
    double vals[20]; vals[0] = 1.0;

    double val = 1.0;
    for ( int i = 0; i < numReplaced; ++i ){ vals[i] = val; val *= (double)(pathLength-i)/(double)(i+1); }
    val = cPAr1; 
    for ( int i = 1; i < numReplaced; ++i ){ vals[i] *= val; val *= cPAr1; }
    val = pown( PAr1, pathLength-numReplaced+1 );
    for ( int i = numReplaced-1; i >= 0; --i ){ vals[i] *= val; val *= PAr1; }
    val = 0.0;
    for ( int i = 0; i < numReplaced; ++i ) val += vals[i];
    return val;
}